

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O3

void __thiscall Proxy::~Proxy(Proxy *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pcVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (this->m_unix_socket_path)._M_dataplus._M_p;
  paVar1 = &(this->m_unix_socket_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (0x10 < (this->proxy).super_CNetAddr.m_addr._size) {
    free((this->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect);
    (this->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Proxy() : m_is_unix_socket(false), m_randomize_credentials(false) {}